

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::f_ftrunc(Forth *this)

{
  double dVar1;
  
  requireFStackDepth(this,1,"FTRUNC");
  dVar1 = ForthStack<double>::getTop(&this->fStack,0);
  if (dVar1 <= 0.0) {
    dVar1 = ceil(dVar1);
  }
  else {
    dVar1 = floor(dVar1);
  }
  ForthStack<double>::setTop(&this->fStack,dVar1);
  return;
}

Assistant:

void f_ftrunc() {
			REQUIRE_FSTACK_DEPTH(1, "FTRUNC");
			auto r1 = fStack.getTop(0);
			if (r1 > 0.0){
				r1 = std::floor(r1);
			}
			else {
				r1 = std::ceil(r1);
			}
			fStack.setTop(r1);
		}